

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

void Js::IntlEngineInterfaceExtensionObject::deletePrototypePropertyHelper
               (ScriptContext *scriptContext,DynamicObject *intlObject,PropertyId objectPropertyId,
               PropertyId getterFunctionId)

{
  BOOL BVar1;
  DynamicObject *pDVar2;
  DynamicObject *pDVar3;
  Var local_50;
  Var setter;
  Var propertyValue;
  Var prototypeValue;
  Var resolvedOptionsValue;
  Var getter;
  
  setter = (Var)0x0;
  propertyValue = (Var)0x0;
  prototypeValue = (Var)0x0;
  resolvedOptionsValue = (Var)0x0;
  local_50 = (Var)0x0;
  BVar1 = JavascriptOperators::GetProperty
                    (&intlObject->super_RecyclableObject,objectPropertyId,&setter,scriptContext,
                     (PropertyValueInfo *)0x0);
  if (BVar1 != 0) {
    BVar1 = JavascriptOperators::IsObject(setter);
    if (BVar1 != 0) {
      pDVar2 = VarTo<Js::DynamicObject>(setter);
      BVar1 = JavascriptOperators::GetProperty
                        (&pDVar2->super_RecyclableObject,0x124,&propertyValue,scriptContext,
                         (PropertyValueInfo *)0x0);
      if (BVar1 != 0) {
        BVar1 = JavascriptOperators::IsObject(propertyValue);
        if (BVar1 != 0) {
          pDVar2 = VarTo<Js::DynamicObject>(propertyValue);
          BVar1 = JavascriptOperators::GetProperty
                            (&pDVar2->super_RecyclableObject,0x210,&prototypeValue,scriptContext,
                             (PropertyValueInfo *)0x0);
          if (BVar1 != 0) {
            BVar1 = JavascriptOperators::IsObject(prototypeValue);
            if (BVar1 != 0) {
              pDVar3 = VarTo<Js::DynamicObject>(prototypeValue);
              (*(pDVar3->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3c])(pDVar3,0x124,1);
              (*(pDVar3->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x21])(pDVar3,0x124,0);
              BVar1 = JavascriptOperators::GetOwnAccessors
                                (pDVar2,getterFunctionId,&resolvedOptionsValue,&local_50,
                                 scriptContext);
              if (BVar1 != 0) {
                BVar1 = JavascriptOperators::IsObject(resolvedOptionsValue);
                if (BVar1 != 0) {
                  pDVar2 = VarTo<Js::DynamicObject>(resolvedOptionsValue);
                  (*(pDVar2->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3c])(pDVar2,0x124,1)
                  ;
                  (*(pDVar2->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x21])(pDVar2,0x124,0)
                  ;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void IntlEngineInterfaceExtensionObject::deletePrototypePropertyHelper(ScriptContext* scriptContext, DynamicObject* intlObject, Js::PropertyId objectPropertyId, Js::PropertyId getterFunctionId)
    {
        DynamicObject *prototypeObject = nullptr;
        DynamicObject *functionObj = nullptr;
        Var propertyValue = nullptr;
        Var prototypeValue = nullptr;
        Var resolvedOptionsValue = nullptr;
        Var getter = nullptr;
        Var setter = nullptr;

        if (!JavascriptOperators::GetProperty(intlObject, objectPropertyId, &propertyValue, scriptContext) ||
            !JavascriptOperators::IsObject(propertyValue))
        {
            return;
        }

        if (!JavascriptOperators::GetProperty(VarTo<DynamicObject>(propertyValue), Js::PropertyIds::prototype, &prototypeValue, scriptContext) ||
            !JavascriptOperators::IsObject(prototypeValue))
        {
            return;
        }

        prototypeObject = VarTo<DynamicObject>(prototypeValue);

        if (!JavascriptOperators::GetProperty(prototypeObject, Js::PropertyIds::resolvedOptions, &resolvedOptionsValue, scriptContext) ||
            !JavascriptOperators::IsObject(resolvedOptionsValue))
        {
            return;
        }

        functionObj = VarTo<DynamicObject>(resolvedOptionsValue);
        functionObj->SetConfigurable(Js::PropertyIds::prototype, true);
        functionObj->DeleteProperty(Js::PropertyIds::prototype, Js::PropertyOperationFlags::PropertyOperation_None);

        if (!JavascriptOperators::GetOwnAccessors(prototypeObject, getterFunctionId, &getter, &setter, scriptContext) ||
            !JavascriptOperators::IsObject(getter))
        {
            return;
        }

        functionObj = VarTo<DynamicObject>(getter);
        functionObj->SetConfigurable(Js::PropertyIds::prototype, true);
        functionObj->DeleteProperty(Js::PropertyIds::prototype, Js::PropertyOperationFlags::PropertyOperation_None);
    }